

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O3

void __thiscall Clasp::mt::ParallelHandler::handleSplitMessage(ParallelHandler *this)

{
  Solver *this_00;
  bool bVar1;
  undefined8 *puVar2;
  
  this_00 = this->solver_;
  puVar2 = (undefined8 *)operator_new(0x10);
  *puVar2 = 0;
  puVar2[1] = 0;
  bVar1 = Solver::split(this_00,(LitVec *)((ulong)puVar2 & 0xfffffffffffffffe));
  if (bVar1) {
    ParallelSolve::SharedData::pushWork
              (this->ctrl_->shared_,(LitVec *)((ulong)puVar2 & 0xfffffffffffffffe));
    return;
  }
  Potassco::fail(-1,"void Clasp::mt::ParallelHandler::handleSplitMessage()",0x34c,"ok",
                 "unexpected call to split",0);
}

Assistant:

void ParallelHandler::handleSplitMessage() {
	assert(solver_ && "ParallelHandler::handleSplitMessage(): not attached!");
	Solver& s = *solver_;
	SingleOwnerPtr<LitVec> newPath(new LitVec());
	bool ok = s.split(*newPath);
	POTASSCO_ASSERT(ok, "unexpected call to split");
	ctrl_->pushWork(newPath.release());
}